

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O0

Node * __thiscall
Parser::createCallNode
          (Parser *this,Token *t,Node *function,vector<Node_*,_std::allocator<Node_*>_> *params)

{
  size_type sVar1;
  vector<Node_*,_std::allocator<Node_*>_> *in_RCX;
  long in_RDX;
  Node *in_RDI;
  size_t i;
  Node *n;
  Token *in_stack_ffffffffffffffa0;
  size_type sVar2;
  CompilationContext *__x;
  size_type local_48;
  CompilationContext *local_8;
  
  if (in_RDX == 0) {
    local_8 = (CompilationContext *)0x0;
  }
  else {
    local_8 = (CompilationContext *)operator_new(0x30);
    Node::Node(in_RDI,local_8,in_stack_ffffffffffffffa0);
    *(undefined4 *)
     &(local_8->suppressWarnings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = 0x17;
    __x = local_8;
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              ((vector<Node_*,_std::allocator<Node_*>_> *)in_RDI,(value_type *)local_8);
    local_48 = 0;
    while (sVar2 = local_48, sVar1 = std::vector<Node_*,_std::allocator<Node_*>_>::size(in_RCX),
          sVar2 < sVar1) {
      std::vector<Node_*,_std::allocator<Node_*>_>::operator[](in_RCX,local_48);
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                ((vector<Node_*,_std::allocator<Node_*>_> *)in_RDI,(value_type *)__x);
      local_48 = local_48 + 1;
    }
  }
  return (Node *)local_8;
}

Assistant:

Node * createCallNode(Token & t, Node * function, vector<Node *> & params)
  {
    if (!function)
      return nullptr;

    Node * n = new Node(ctx, t);
    n->nodeType = PNT_FUNCTION_CALL;
    n->children.push_back(function);
    for (size_t i = 0; i < params.size(); i++)
      n->children.push_back(params[i]);
    return n;
  }